

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

void __thiscall USBControlTransferParser::ParseCDCDataStage(USBControlTransferParser *this)

{
  U8 UVar1;
  USBCDCRequestCode reqCode;
  USBControlTransferParser *this_local;
  
  UVar1 = (this->mRequest).bRequest;
  if ((UVar1 == '\x03') || (UVar1 == '\x02')) {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    if ((this->mRequest).wValue == 1) {
      ParseStructure(this,CDCAbstractStateFields);
    }
    else if ((this->mRequest).wValue == 2) {
      ParseStructure(this,CDCCountrySettingFields);
    }
    else {
      ParseUnknownResponse(this);
    }
  }
  else if ((UVar1 == ' ') || (UVar1 == '!')) {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCLineCodingFields);
  }
  else if ((UVar1 == '0') || (UVar1 == '1')) {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCRingerConfigFields);
  }
  else if (UVar1 == '3') {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCOperationModeFields);
  }
  else if ((UVar1 == '4') || (UVar1 == '5')) {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCLineParmsFields);
  }
  else if ((UVar1 == '7') || (UVar1 == '8')) {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCUnitParameterFields);
  }
  else if (((UVar1 == 'D') || (UVar1 == 'Q')) || (UVar1 == 'S')) {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCUnsignedIntFields);
  }
  else if (UVar1 == 'R') {
    this->mDescBytes = (uint)(this->mRequest).wLength;
    this->mParsedOffset = 0;
    ParseStructure(this,CDCATMDefaultVCFields);
  }
  else {
    ParseUnknownResponse(this);
  }
  return;
}

Assistant:

void USBControlTransferParser::ParseCDCDataStage()
{
    USBCDCRequestCode reqCode = ( USBCDCRequestCode )mRequest.bRequest;

    if( reqCode == GET_COMM_FEATURE || reqCode == SET_COMM_FEATURE )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;

        if( mRequest.wValue == 1 ) // ABSTRACT_STATE
            ParseStructure( CDCAbstractStateFields );
        else if( mRequest.wValue == 2 ) // COUNTRY_SETTING
            ParseStructure( CDCCountrySettingFields );
        else
            ParseUnknownResponse();
    }
    else if( reqCode == SET_LINE_CODING || reqCode == GET_LINE_CODING )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCLineCodingFields );
    }
    else if( reqCode == SET_RINGER_PARMS || reqCode == GET_RINGER_PARMS )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCRingerConfigFields );
    }
    else if( reqCode == GET_OPERATION_PARMS )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCOperationModeFields );
    }
    else if( reqCode == SET_LINE_PARMS || reqCode == GET_LINE_PARMS )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCLineParmsFields );
    }
    else if( reqCode == SET_UNIT_PARAMETER || reqCode == GET_UNIT_PARAMETER )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCUnitParameterFields );
    }
    else if( reqCode == GET_ETHERNET_STATISTIC || reqCode == GET_ATM_DEVICE_STATISTICS || reqCode == GET_ATM_VC_STATISTICS )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCUnsignedIntFields );
    }
    else if( reqCode == SET_ATM_DEFAULT_VC )
    {
        mDescBytes = mRequest.wLength;
        mParsedOffset = 0;
        ParseStructure( CDCATMDefaultVCFields );
    }
    else
    {
        ParseUnknownResponse();
    }
}